

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::ImageTests::addCreateRenderbuffer(ImageTests *this,string *name,GLenum format)

{
  Create *this_00;
  DefaultDeleter<deqp::egl::Image::Action> local_4e;
  undefined1 local_4d;
  MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  local_40;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_30;
  GLenum local_1c;
  string *psStack_18;
  GLenum format_local;
  string *name_local;
  ImageTests *this_local;
  
  local_1c = format;
  psStack_18 = name;
  name_local = (string *)this;
  this_00 = (Create *)operator_new(0x18);
  local_4d = 1;
  createRenderbufferImageSource(&local_40,local_1c);
  GLES2ImageApi::Create::Create(this_00,&local_40);
  local_4d = 0;
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_4e);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_30,this_00);
  LabeledActions::add(&this->m_createActions,name,&local_30);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_30);
  de::details::
  MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>::
  ~MovePtr(&local_40);
  return;
}

Assistant:

void ImageTests::addCreateRenderbuffer (const string& name, GLenum format)
{
	m_createActions.add(name, MovePtr<Action>(new GLES2ImageApi::Create(createRenderbufferImageSource(format))));
}